

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

bool __thiscall version_struct::operator<=(version_struct *this,char *v_str)

{
  version_struct v_tmp;
  int local_1c;
  int local_18;
  int local_14;
  
  __isoc99_sscanf(v_str,"%d.%d.%d",&local_1c,&local_18,&local_14);
  if (this->major < local_1c) {
    return true;
  }
  if (this->major <= local_1c) {
    if (this->minor < local_18) {
      return true;
    }
    if (this->minor <= local_18) {
      return this->rev <= local_14;
    }
  }
  return false;
}

Assistant:

bool operator<=(const char* v_str)
  {
    version_struct v_tmp(v_str);
    return (*this <= v_tmp);
  }